

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KUtils.h
# Opt level: O0

KString * KDIS::UTILS::IndentString
                    (KString *__return_storage_ptr__,KString *S,KUINT16 Tabs,KCHAR8 Tab)

{
  ulong uVar1;
  long lVar2;
  ushort local_1b6;
  KUINT16 i;
  stringstream local_1a8 [8];
  KStringStream NewS;
  ostream local_198 [381];
  KCHAR8 local_1b;
  KUINT16 local_1a;
  KCHAR8 Tab_local;
  KString *pKStack_18;
  KUINT16 Tabs_local;
  KString *S_local;
  
  local_1b = Tab;
  local_1a = Tabs;
  pKStack_18 = S;
  S_local = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a8);
  AddTabsToStringStream((KStringStream *)local_1a8,local_1a,local_1b);
  local_1b6 = 0;
  do {
    uVar1 = std::__cxx11::string::size();
    if (uVar1 <= local_1b6) {
      std::__cxx11::stringstream::str();
      std::__cxx11::stringstream::~stringstream(local_1a8);
      return __return_storage_ptr__;
    }
    lVar2 = std::__cxx11::string::c_str();
    if (*(char *)(lVar2 + (ulong)local_1b6) == '\n') {
      lVar2 = std::__cxx11::string::size();
      if ((ulong)local_1b6 == lVar2 - 1U) goto LAB_002893ab;
      lVar2 = std::__cxx11::string::c_str();
      std::operator<<(local_198,*(char *)(lVar2 + (ulong)local_1b6));
      AddTabsToStringStream((KStringStream *)local_1a8,local_1a,local_1b);
    }
    else {
LAB_002893ab:
      lVar2 = std::__cxx11::string::c_str();
      std::operator<<(local_198,*(char *)(lVar2 + (ulong)local_1b6));
    }
    local_1b6 = local_1b6 + 1;
  } while( true );
}

Assistant:

static inline KString IndentString( const KString & S, KUINT16 Tabs = 1, KCHAR8 Tab = '\t' )
{
    KStringStream NewS;

    // Add tab to first item and then check all new lines
    AddTabsToStringStream( NewS, Tabs, Tab );

    for( KUINT16 i = 0; i < S.size(); ++i )
    {
        if( S.c_str()[i] == '\n' && i != ( S.size() - 1 ) )
        {
            NewS << S.c_str()[i];
            AddTabsToStringStream( NewS, Tabs, Tab );
        }
        else
        {
            NewS << S.c_str()[i];
        }
    }

    return NewS.str();
}